

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

bool __thiscall
wallet::CWallet::AddToWalletIfInvolvingMe
          (CWallet *this,CTransactionRef *ptx,SyncTxState *state,bool fUpdate,
          bool rescanning_old_block)

{
  long lVar1;
  ScriptPubKeyMan *pSVar2;
  bool bVar3;
  add_pointer_t<const_wallet::TxStateConfirmed> ptVar4;
  pointer pvVar5;
  size_type sVar6;
  reference pCVar7;
  reference pWVar8;
  bool *pbVar9;
  CAddressBookData *pCVar10;
  CWalletTx *pCVar11;
  runtime_error *this_00;
  byte in_CL;
  long in_FS_OFFSET;
  CWalletTx *wtx;
  WalletDestination *dest;
  vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *__range5;
  ScriptPubKeyMan **spk_man;
  set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
  *__range4;
  CTxOut *txout;
  vector<CTxOut,_std::allocator<CTxOut>_> *__range3_1;
  bool fExisted;
  CTxIn *txin;
  vector<CTxIn,_std::allocator<CTxIn>_> *__range3;
  TxStateConfirmed *conf;
  CTransaction *tx;
  iterator __end5;
  iterator __begin5;
  iterator __end4;
  iterator __begin4;
  const_iterator __end3_1;
  const_iterator __begin3_1;
  pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  range;
  const_iterator __end3;
  const_iterator __begin3;
  TxState tx_state;
  CTransaction *in_stack_fffffffffffffce8;
  CWallet *in_stack_fffffffffffffcf0;
  function<bool_(wallet::CWalletTx_&,_bool)> *in_stack_fffffffffffffcf8;
  undefined7 in_stack_fffffffffffffd00;
  undefined1 in_stack_fffffffffffffd07;
  CTransaction *in_stack_fffffffffffffd08;
  CWallet *in_stack_fffffffffffffd10;
  string *in_stack_fffffffffffffd18;
  CWallet *in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  CWallet *in_stack_fffffffffffffd48;
  add_pointer_t<const_wallet::TxStateConfirmed> ptVar12;
  ConstevalFormatString<5U> in_stack_fffffffffffffd78;
  ScriptPubKeyMan *in_stack_fffffffffffffd88;
  CScript *in_stack_fffffffffffffd98;
  CWallet *in_stack_fffffffffffffda0;
  _Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> in_stack_fffffffffffffdd0;
  bool local_1c9;
  allocator<char> local_18b;
  _Optional_payload_base<bool> local_18a;
  WalletDestination *local_188;
  WalletDestination *local_180;
  undefined1 local_178 [32];
  _Base_ptr local_158;
  CTxOut *local_150;
  CTxOut *local_148;
  pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
  local_140;
  CTxIn *local_120;
  CTxIn *local_118;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  UpdateWalletTxFn *in_stack_fffffffffffffef8;
  TxState *in_stack_ffffffffffffff00;
  undefined8 in_stack_ffffffffffffff08;
  CWallet *in_stack_ffffffffffffff10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_fffffffffffffcf8);
  AssertLockHeldInternal<AnnotatedMixin<std::recursive_mutex>>
            ((char *)in_stack_fffffffffffffcf8,(char *)in_stack_fffffffffffffcf0,
             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
             (AnnotatedMixin<std::recursive_mutex> *)0x1701116);
  ptVar4 = std::
           get_if<wallet::TxStateConfirmed,wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateInactive>
                     ((variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                       *)in_stack_fffffffffffffce8);
  if (ptVar4 != (add_pointer_t<const_wallet::TxStateConfirmed>)0x0) {
    local_118 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::begin
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    in_stack_fffffffffffffcf0);
    local_120 = (CTxIn *)std::vector<CTxIn,_std::allocator<CTxIn>_>::end
                                   ((vector<CTxIn,_std::allocator<CTxIn>_> *)
                                    in_stack_fffffffffffffcf0);
    while (bVar3 = __gnu_cxx::operator==<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                             ((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffcf8,
                              (__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>
                               *)in_stack_fffffffffffffcf0), ((bVar3 ^ 0xffU) & 1) != 0) {
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator*((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                in_stack_fffffffffffffce8);
      local_140 = std::
                  unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                  ::equal_range((unordered_multimap<COutPoint,_uint256,_SaltedOutpointHasher,_std::equal_to<COutPoint>,_std::allocator<std::pair<const_COutPoint,_uint256>_>_>
                                 *)in_stack_fffffffffffffcf8,(key_type *)in_stack_fffffffffffffcf0);
      std::
      pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
      ::
      pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_true>
                ((pair<std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                  *)in_stack_fffffffffffffcf8,
                 (pair<std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>,_std::__detail::_Node_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>_>
                  *)in_stack_fffffffffffffcf0);
      while (bVar3 = std::__detail::operator==
                               ((_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                                in_stack_fffffffffffffcf8,
                                (_Node_iterator_base<std::pair<const_COutPoint,_uint256>,_false> *)
                                in_stack_fffffffffffffcf0), ((bVar3 ^ 0xffU) & 1) != 0) {
        pvVar5 = std::__detail::
                 _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::operator->
                           ((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>
                             *)in_stack_fffffffffffffce8);
        in_stack_fffffffffffffd78.fmt = (char *)&pvVar5->second;
        CTransaction::GetHash(in_stack_fffffffffffffce8);
        transaction_identifier::operator_cast_to_uint256_
                  ((transaction_identifier<false> *)in_stack_fffffffffffffce8);
        bVar3 = ::operator!=((base_blob<256U> *)in_stack_fffffffffffffcf8,
                             (base_blob<256U> *)in_stack_fffffffffffffcf0);
        if (bVar3) {
          CTransaction::GetHash(in_stack_fffffffffffffce8);
          transaction_identifier<false>::ToString_abi_cxx11_
                    ((transaction_identifier<false> *)in_stack_fffffffffffffcf0);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffcf0);
          std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
          operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                     in_stack_fffffffffffffce8);
          base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_fffffffffffffcf0);
          std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
          operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                     in_stack_fffffffffffffce8);
          transaction_identifier<false>::ToString_abi_cxx11_
                    ((transaction_identifier<false> *)in_stack_fffffffffffffcf0);
          pvVar5 = std::__detail::
                   _Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
                   operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>
                               *)in_stack_fffffffffffffce8);
          in_stack_fffffffffffffce8 = (CTransaction *)&(pvVar5->first).n;
          WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,unsigned_int>
                    (in_stack_fffffffffffffd48,in_stack_fffffffffffffd78,in_stack_fffffffffffffd40,
                     in_stack_fffffffffffffd38,in_stack_fffffffffffffd30,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                     (uint *)in_stack_fffffffffffffdd0._M_cur);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffce8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffce8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffce8);
          std::__cxx11::string::~string
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffce8);
          ptVar12 = ptVar4;
          std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>::
          operator->((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *)
                     in_stack_fffffffffffffce8);
          MarkConflicted(in_stack_fffffffffffffd20,(uint256 *)in_stack_fffffffffffffd18,
                         (int)((ulong)ptVar12 >> 0x20),(uint256 *)in_stack_fffffffffffffd10);
        }
        in_stack_fffffffffffffdd0._M_cur =
             (__node_type *)
             std::__detail::_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false>
             ::operator++((_Node_const_iterator<std::pair<const_COutPoint,_uint256>,_false,_false> *
                          )in_stack_fffffffffffffcf0,(int)((ulong)in_stack_fffffffffffffce8 >> 0x20)
                         );
      }
      __gnu_cxx::__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_>::
      operator++((__normal_iterator<const_CTxIn_*,_std::vector<CTxIn,_std::allocator<CTxIn>_>_> *)
                 in_stack_fffffffffffffce8);
    }
  }
  CTransaction::GetHash(in_stack_fffffffffffffce8);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_fffffffffffffce8);
  sVar6 = std::
          unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
          ::count((unordered_map<uint256,_wallet::CWalletTx,_SaltedTxidHasher,_std::equal_to<uint256>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>_>
                   *)in_stack_fffffffffffffcf8,(key_type *)in_stack_fffffffffffffcf0);
  if ((sVar6 == 0) || ((in_CL & 1) != 0)) {
    if ((sVar6 != 0) ||
       ((bVar3 = IsMine(in_stack_fffffffffffffd10,in_stack_fffffffffffffd08), bVar3 ||
        (bVar3 = IsFromMe(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8), bVar3)))) {
      local_148 = (CTxOut *)
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::begin
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffcf0);
      local_150 = (CTxOut *)
                  std::vector<CTxOut,_std::allocator<CTxOut>_>::end
                            ((vector<CTxOut,_std::allocator<CTxOut>_> *)in_stack_fffffffffffffcf0);
      while (bVar3 = __gnu_cxx::
                     operator==<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                               ((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)in_stack_fffffffffffffcf8,
                                (__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                                 *)in_stack_fffffffffffffcf0), ((bVar3 ^ 0xffU) & 1) != 0) {
        pCVar7 = __gnu_cxx::
                 __normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>::
                 operator*((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                            *)in_stack_fffffffffffffce8);
        GetScriptPubKeyMans(in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
        local_158 = (_Base_ptr)
                    std::
                    set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                    ::begin((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                             *)in_stack_fffffffffffffcf0);
        local_178._24_8_ =
             std::
             set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
             ::end((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                    *)in_stack_fffffffffffffcf0);
        while (bVar3 = std::operator==((_Self *)in_stack_fffffffffffffcf8,
                                       (_Self *)in_stack_fffffffffffffcf0),
              ((bVar3 ^ 0xffU) & 1) != 0) {
          in_stack_fffffffffffffda0 =
               (CWallet *)
               std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator*
                         ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)
                          in_stack_fffffffffffffce8);
          pSVar2 = (ScriptPubKeyMan *)
                   (in_stack_fffffffffffffda0->super_WalletStorage)._vptr_WalletStorage;
          (*pSVar2->_vptr_ScriptPubKeyMan[10])(local_178,pSVar2,&pCVar7->scriptPubKey);
          in_stack_fffffffffffffd98 = (CScript *)local_178;
          local_180 = (WalletDestination *)
                      std::
                      vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
                      ::begin((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
                               *)in_stack_fffffffffffffcf0);
          local_188 = (WalletDestination *)
                      std::
                      vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
                      ::end((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>
                             *)in_stack_fffffffffffffcf0);
          while (bVar3 = __gnu_cxx::
                         operator==<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                                   ((__normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                                     *)in_stack_fffffffffffffcf8,
                                    (__normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                                     *)in_stack_fffffffffffffcf0), ((bVar3 ^ 0xffU) & 1) != 0) {
            pWVar8 = __gnu_cxx::
                     __normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                     ::operator*((__normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                                  *)in_stack_fffffffffffffce8);
            bVar3 = std::optional<bool>::has_value((optional<bool> *)in_stack_fffffffffffffce8);
            if (!bVar3) {
              local_18a = (_Optional_payload_base<bool>)
                          IsInternalScriptPubKeyMan
                                    ((CWallet *)in_stack_fffffffffffffd78.fmt,
                                     in_stack_fffffffffffffd88);
              (pWVar8->internal).super__Optional_base<bool,_true,_true>._M_payload.
              super__Optional_payload_base<bool> = local_18a;
            }
            bVar3 = std::optional<bool>::has_value((optional<bool> *)in_stack_fffffffffffffce8);
            if (((bVar3) &&
                (pbVar9 = std::optional<bool>::operator*
                                    ((optional<bool> *)in_stack_fffffffffffffce8),
                (*pbVar9 & 1U) == 0)) &&
               (pCVar10 = FindAddressBookEntry
                                    (in_stack_fffffffffffffd10,
                                     (CTxDestination *)in_stack_fffffffffffffd08,
                                     (bool)in_stack_fffffffffffffd07),
               pCVar10 == (CAddressBookData *)0x0)) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffd38,(char *)in_stack_fffffffffffffd30,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28));
              in_stack_fffffffffffffd38 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xfffffffffffffef4;
              std::optional<wallet::AddressPurpose>::optional<wallet::AddressPurpose,_true>
                        ((optional<wallet::AddressPurpose> *)in_stack_fffffffffffffcf8,
                         (AddressPurpose *)in_stack_fffffffffffffcf0);
              SetAddressBook((CWallet *)
                             CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                             (CTxDestination *)in_stack_fffffffffffffd20,in_stack_fffffffffffffd18,
                             (optional<wallet::AddressPurpose> *)in_stack_fffffffffffffd10);
              std::__cxx11::string::~string
                        ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffce8);
              std::allocator<char>::~allocator(&local_18b);
            }
            __gnu_cxx::
            __normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
            ::operator++((__normal_iterator<wallet::WalletDestination_*,_std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>_>
                          *)in_stack_fffffffffffffce8);
          }
          std::vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_>::
          ~vector((vector<wallet::WalletDestination,_std::allocator<wallet::WalletDestination>_> *)
                  in_stack_fffffffffffffcf8);
          std::_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*>::operator++
                    ((_Rb_tree_const_iterator<wallet::ScriptPubKeyMan_*> *)in_stack_fffffffffffffce8
                    );
        }
        std::
        set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
        ::~set((set<wallet::ScriptPubKeyMan_*,_std::less<wallet::ScriptPubKeyMan_*>,_std::allocator<wallet::ScriptPubKeyMan_*>_>
                *)in_stack_fffffffffffffce8);
        __gnu_cxx::__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
        ::operator++((__normal_iterator<const_CTxOut_*,_std::vector<CTxOut,_std::allocator<CTxOut>_>_>
                      *)in_stack_fffffffffffffce8);
      }
      std::
      visit<wallet::CWallet::AddToWalletIfInvolvingMe(std::shared_ptr<CTransaction_const>const&,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateInactive>const&,bool,bool)::__0,std::variant<wallet::TxStateConfirmed,wallet::TxStateInMempool,wallet::TxStateInactive>const&>
                ((anon_class_1_0_00000001 *)in_stack_fffffffffffffd08,
                 (variant<wallet::TxStateConfirmed,_wallet::TxStateInMempool,_wallet::TxStateInactive>
                  *)CONCAT17(in_stack_fffffffffffffd07,in_stack_fffffffffffffd00));
      MakeTransactionRef<CTransaction_const&>((CTransaction *)in_stack_fffffffffffffcf0);
      std::function<bool_(wallet::CWalletTx_&,_bool)>::function
                (in_stack_fffffffffffffcf8,in_stack_fffffffffffffcf0);
      pCVar11 = AddToWallet(in_stack_ffffffffffffff10,(CTransactionRef *)in_stack_ffffffffffffff08,
                            in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,
                            (bool)in_stack_fffffffffffffef7,(bool)in_stack_fffffffffffffef6);
      std::function<bool_(wallet::CWalletTx_&,_bool)>::~function
                ((function<bool_(wallet::CWalletTx_&,_bool)> *)in_stack_fffffffffffffce8);
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_fffffffffffffce8);
      if (pCVar11 == (CWalletTx *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_00,"DB error adding transaction to wallet, write failed");
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_01701b0c;
      }
      local_1c9 = true;
    }
    else {
      local_1c9 = false;
    }
  }
  else {
    local_1c9 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_1c9;
  }
LAB_01701b0c:
  __stack_chk_fail();
}

Assistant:

bool CWallet::AddToWalletIfInvolvingMe(const CTransactionRef& ptx, const SyncTxState& state, bool fUpdate, bool rescanning_old_block)
{
    const CTransaction& tx = *ptx;
    {
        AssertLockHeld(cs_wallet);

        if (auto* conf = std::get_if<TxStateConfirmed>(&state)) {
            for (const CTxIn& txin : tx.vin) {
                std::pair<TxSpends::const_iterator, TxSpends::const_iterator> range = mapTxSpends.equal_range(txin.prevout);
                while (range.first != range.second) {
                    if (range.first->second != tx.GetHash()) {
                        WalletLogPrintf("Transaction %s (in block %s) conflicts with wallet transaction %s (both spend %s:%i)\n", tx.GetHash().ToString(), conf->confirmed_block_hash.ToString(), range.first->second.ToString(), range.first->first.hash.ToString(), range.first->first.n);
                        MarkConflicted(conf->confirmed_block_hash, conf->confirmed_block_height, range.first->second);
                    }
                    range.first++;
                }
            }
        }

        bool fExisted = mapWallet.count(tx.GetHash()) != 0;
        if (fExisted && !fUpdate) return false;
        if (fExisted || IsMine(tx) || IsFromMe(tx))
        {
            /* Check if any keys in the wallet keypool that were supposed to be unused
             * have appeared in a new transaction. If so, remove those keys from the keypool.
             * This can happen when restoring an old wallet backup that does not contain
             * the mostly recently created transactions from newer versions of the wallet.
             */

            // loop though all outputs
            for (const CTxOut& txout: tx.vout) {
                for (const auto& spk_man : GetScriptPubKeyMans(txout.scriptPubKey)) {
                    for (auto &dest : spk_man->MarkUnusedAddresses(txout.scriptPubKey)) {
                        // If internal flag is not defined try to infer it from the ScriptPubKeyMan
                        if (!dest.internal.has_value()) {
                            dest.internal = IsInternalScriptPubKeyMan(spk_man);
                        }

                        // skip if can't determine whether it's a receiving address or not
                        if (!dest.internal.has_value()) continue;

                        // If this is a receiving address and it's not in the address book yet
                        // (e.g. it wasn't generated on this node or we're restoring from backup)
                        // add it to the address book for proper transaction accounting
                        if (!*dest.internal && !FindAddressBookEntry(dest.dest, /* allow_change= */ false)) {
                            SetAddressBook(dest.dest, "", AddressPurpose::RECEIVE);
                        }
                    }
                }
            }

            // Block disconnection override an abandoned tx as unconfirmed
            // which means user may have to call abandontransaction again
            TxState tx_state = std::visit([](auto&& s) -> TxState { return s; }, state);
            CWalletTx* wtx = AddToWallet(MakeTransactionRef(tx), tx_state, /*update_wtx=*/nullptr, /*fFlushOnClose=*/false, rescanning_old_block);
            if (!wtx) {
                // Can only be nullptr if there was a db write error (missing db, read-only db or a db engine internal writing error).
                // As we only store arriving transaction in this process, and we don't want an inconsistent state, let's throw an error.
                throw std::runtime_error("DB error adding transaction to wallet, write failed");
            }
            return true;
        }
    }
    return false;
}